

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedSnapshotRecord.cpp
# Opt level: O2

void __thiscall
cali::CompressedSnapshotRecordView::unpack_immediate
          (CompressedSnapshotRecordView *this,size_t n,cali_id_t *attr_vec,Variant *data_vec)

{
  uint64_t uVar1;
  anon_union_8_7_33918203_for_value *paVar2;
  ulong uVar3;
  cali_variant_t cVar4;
  size_t pos;
  size_t local_38;
  
  if (this->m_num_imm < n) {
    n = this->m_num_imm;
  }
  local_38 = this->m_imm_pos + 1;
  paVar2 = &(data_vec->m_v).value;
  for (uVar3 = 0; n != uVar3; uVar3 = uVar3 + 1) {
    uVar1 = vldec_u64(this->m_buffer + local_38,&local_38);
    attr_vec[uVar3] = uVar1;
    cVar4 = cali_variant_unpack(this->m_buffer + local_38,&local_38,(_Bool *)0x0);
    ((cali_variant_t *)(paVar2 + -1))->type_and_size = cVar4.type_and_size;
    paVar2->v_uint = (uint64_t)cVar4.value;
    paVar2 = paVar2 + 2;
  }
  return;
}

Assistant:

void CompressedSnapshotRecordView::unpack_immediate(size_t n, cali_id_t attr_vec[], Variant data_vec[]) const
{
    size_t max = std::min(n, m_num_imm);
    size_t pos = m_imm_pos + 1;

    for (size_t i = 0; i < max; ++i) {
        attr_vec[i] = vldec_u64(m_buffer + pos, &pos);
        data_vec[i] = Variant::unpack(m_buffer + pos, &pos, nullptr);
    }
}